

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O3

void __thiscall SRUP_MSG::~SRUP_MSG(SRUP_MSG *this)

{
  this->_vptr_SRUP_MSG = (_func_int **)&PTR__SRUP_MSG_001b23e8;
  if (this->m_version != (uint8_t *)0x0) {
    operator_delete__(this->m_version);
  }
  if (this->m_msgtype != (uint8_t *)0x0) {
    operator_delete__(this->m_msgtype);
  }
  if (this->m_unsigned_message != (uint8_t *)0x0) {
    operator_delete__(this->m_unsigned_message);
  }
  if (this->m_signature != (uint8_t *)0x0) {
    operator_delete__(this->m_signature);
  }
  if (this->m_token != (uint8_t *)0x0) {
    operator_delete__(this->m_token);
  }
  if (this->m_serialized != (uint8_t *)0x0) {
    operator_delete__(this->m_serialized);
  }
  operator_delete(this->m_sequence_ID);
  operator_delete(this->m_sender_ID);
  return;
}

Assistant:

SRUP_MSG::~SRUP_MSG()
{
    delete[] m_version;
    delete[] m_msgtype;
    delete[] m_unsigned_message;
    delete[] m_signature;
    delete[] m_token;
    delete[] m_serialized;
    delete (m_sequence_ID);
    delete (m_sender_ID);
}